

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O3

void __thiscall wasm::BinaryInstWriter::visitStore(BinaryInstWriter *this,Store *curr)

{
  uint8_t uVar1;
  ulong uVar2;
  int iVar3;
  uint *__n;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar4;
  LEB<unsigned_int,_unsigned_char> local_2c;
  
  if (curr->isAtomic == false) {
    __n = &switchD_00c974e7::switchdataD_00e35508;
    switch((curr->valueType).id) {
    case 0:
    case 1:
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                         ,0x18c);
    case 2:
      uVar1 = curr->bytes;
      if (uVar1 == '\x04') {
        pvVar4 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
        local_2c.value._0_1_ = 0x36;
      }
      else if (uVar1 == '\x02') {
        pvVar4 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
        local_2c.value._0_1_ = 0x3b;
      }
      else {
        if (uVar1 != '\x01') goto switchD_00c97599_caseD_3;
        pvVar4 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
        local_2c.value._0_1_ = 0x3a;
      }
      break;
    case 3:
      switch(curr->bytes) {
      case '\x01':
        pvVar4 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
        local_2c.value._0_1_ = 0x3c;
        break;
      case '\x02':
        pvVar4 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
        local_2c.value._0_1_ = 0x3d;
        break;
      default:
switchD_00c97599_caseD_3:
        abort();
      case '\x04':
        pvVar4 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
        local_2c.value._0_1_ = 0x3e;
        break;
      case '\b':
        pvVar4 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
        local_2c.value._0_1_ = 0x37;
      }
      break;
    case 4:
      if (curr->bytes != '\x04') {
        if (curr->bytes != '\x02') {
          handle_unreachable("invalid store size",
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                             ,0x17f);
        }
        pvVar4 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
        local_2c.value._0_1_ = 0xfc;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (pvVar4,(uchar *)&local_2c);
        local_2c.value = 0x31;
        __buf = extraout_RDX_00;
        goto LAB_00c975de;
      }
      pvVar4 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
      local_2c.value._0_1_ = 0x38;
      break;
    case 5:
      pvVar4 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
      local_2c.value._0_1_ = 0x39;
      break;
    case 6:
      pvVar4 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
      local_2c.value._0_1_ = 0xfd;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (pvVar4,(uchar *)&local_2c);
      local_2c.value = 0xb;
      __buf = extraout_RDX;
LAB_00c975de:
      LEB<unsigned_int,_unsigned_char>::write(&local_2c,(int)pvVar4,__buf,(size_t)__n);
      goto LAB_00c97684;
    default:
switchD_00c974e7_default:
      __assert_fail("isBasic() && \"Basic type expected\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                    ,0x1c4,"BasicType wasm::Type::getBasic() const");
    }
  }
  else {
    local_2c.value._0_1_ = 0xfe;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
               (uchar *)&local_2c);
    uVar2 = (curr->valueType).id;
    if (6 < uVar2) goto switchD_00c974e7_default;
    iVar3 = (int)uVar2;
    if (iVar3 == 3) {
      switch(curr->bytes) {
      case '\x01':
        pvVar4 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
        local_2c.value._0_1_ = 0x1b;
        break;
      case '\x02':
        pvVar4 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
        local_2c.value._0_1_ = 0x1c;
        break;
      default:
        handle_unreachable("invalid store size",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                           ,0x1b0);
      case '\x04':
        pvVar4 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
        local_2c.value._0_1_ = 0x1d;
        break;
      case '\b':
        pvVar4 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
        local_2c.value._0_1_ = 0x18;
      }
    }
    else {
      if (iVar3 != 2) {
        handle_unreachable("unexpected type",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                           ,0x1b5);
      }
      uVar1 = curr->bytes;
      if (uVar1 == '\x04') {
        pvVar4 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
        local_2c.value._0_1_ = 0x17;
      }
      else if (uVar1 == '\x02') {
        pvVar4 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
        local_2c.value._0_1_ = 0x1a;
      }
      else {
        if (uVar1 != '\x01') {
          handle_unreachable("invalid store size",
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                             ,0x19d);
        }
        pvVar4 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
        local_2c.value._0_1_ = 0x19;
      }
    }
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (pvVar4,(uchar *)&local_2c);
LAB_00c97684:
  emitMemoryAccess(this,(curr->align).addr,(ulong)curr->bytes,(curr->offset).addr,
                   (Name)(curr->memory).super_IString.str);
  return;
}

Assistant:

void BinaryInstWriter::visitStore(Store* curr) {
  if (!curr->isAtomic) {
    switch (curr->valueType.getBasic()) {
      case Type::i32: {
        switch (curr->bytes) {
          case 1:
            o << int8_t(BinaryConsts::I32StoreMem8);
            break;
          case 2:
            o << int8_t(BinaryConsts::I32StoreMem16);
            break;
          case 4:
            o << int8_t(BinaryConsts::I32StoreMem);
            break;
          default:
            abort();
        }
        break;
      }
      case Type::i64: {
        switch (curr->bytes) {
          case 1:
            o << int8_t(BinaryConsts::I64StoreMem8);
            break;
          case 2:
            o << int8_t(BinaryConsts::I64StoreMem16);
            break;
          case 4:
            o << int8_t(BinaryConsts::I64StoreMem32);
            break;
          case 8:
            o << int8_t(BinaryConsts::I64StoreMem);
            break;
          default:
            abort();
        }
        break;
      }
      case Type::f32: {
        switch (curr->bytes) {
          case 2:
            o << int8_t(BinaryConsts::MiscPrefix)
              << U32LEB(BinaryConsts::F32_F16StoreMem);
            break;
          case 4:
            o << int8_t(BinaryConsts::F32StoreMem);
            break;
          default:
            WASM_UNREACHABLE("invalid store size");
        }
        break;
      }
      case Type::f64:
        o << int8_t(BinaryConsts::F64StoreMem);
        break;
      case Type::v128:
        o << int8_t(BinaryConsts::SIMDPrefix)
          << U32LEB(BinaryConsts::V128Store);
        break;
      case Type::none:
      case Type::unreachable:
        WASM_UNREACHABLE("unexpected type");
    }
  } else {
    o << int8_t(BinaryConsts::AtomicPrefix);
    switch (curr->valueType.getBasic()) {
      case Type::i32: {
        switch (curr->bytes) {
          case 1:
            o << int8_t(BinaryConsts::I32AtomicStore8);
            break;
          case 2:
            o << int8_t(BinaryConsts::I32AtomicStore16);
            break;
          case 4:
            o << int8_t(BinaryConsts::I32AtomicStore);
            break;
          default:
            WASM_UNREACHABLE("invalid store size");
        }
        break;
      }
      case Type::i64: {
        switch (curr->bytes) {
          case 1:
            o << int8_t(BinaryConsts::I64AtomicStore8);
            break;
          case 2:
            o << int8_t(BinaryConsts::I64AtomicStore16);
            break;
          case 4:
            o << int8_t(BinaryConsts::I64AtomicStore32);
            break;
          case 8:
            o << int8_t(BinaryConsts::I64AtomicStore);
            break;
          default:
            WASM_UNREACHABLE("invalid store size");
        }
        break;
      }
      default:
        WASM_UNREACHABLE("unexpected type");
    }
  }
  emitMemoryAccess(curr->align, curr->bytes, curr->offset, curr->memory);
}